

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGFreeValidCtxt(xmlRelaxNGValidCtxtPtr ctxt)

{
  xmlRegExecCtxtPtr exec;
  xmlRelaxNGStatesPtr pxVar1;
  long lVar2;
  
  if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
    pxVar1 = ctxt->states;
    if (pxVar1 != (xmlRelaxNGStatesPtr)0x0) {
      (*xmlFree)(pxVar1->tabState);
      (*xmlFree)(pxVar1);
    }
    pxVar1 = ctxt->freeState;
    if (pxVar1 != (xmlRelaxNGStatesPtr)0x0) {
      for (lVar2 = 0; lVar2 < pxVar1->nbState; lVar2 = lVar2 + 1) {
        xmlRelaxNGFreeValidState((xmlRelaxNGValidCtxtPtr)0x0,pxVar1->tabState[lVar2]);
        pxVar1 = ctxt->freeState;
      }
      (*xmlFree)(pxVar1->tabState);
      (*xmlFree)(pxVar1);
    }
    if (ctxt->freeStates != (xmlRelaxNGStatesPtr *)0x0) {
      for (lVar2 = 0; lVar2 < ctxt->freeStatesNr; lVar2 = lVar2 + 1) {
        xmlRelaxNGFreeStates((xmlRelaxNGValidCtxtPtr)0x0,ctxt->freeStates[lVar2]);
      }
      (*xmlFree)(ctxt->freeStates);
    }
    if (ctxt->errTab != (xmlRelaxNGValidErrorPtr)0x0) {
      (*xmlFree)(ctxt->errTab);
    }
    if (ctxt->elemTab != (xmlRegExecCtxtPtr *)0x0) {
      while( true ) {
        exec = xmlRelaxNGElemPop(ctxt);
        if (exec == (xmlRegExecCtxtPtr)0x0) break;
        xmlRegFreeExecCtxt(exec);
      }
      (*xmlFree)(ctxt->elemTab);
    }
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlRelaxNGFreeValidCtxt(xmlRelaxNGValidCtxtPtr ctxt)
{
    int k;

    if (ctxt == NULL)
        return;
    if (ctxt->states != NULL)
        xmlRelaxNGFreeStates(NULL, ctxt->states);
    if (ctxt->freeState != NULL) {
        for (k = 0; k < ctxt->freeState->nbState; k++) {
            xmlRelaxNGFreeValidState(NULL, ctxt->freeState->tabState[k]);
        }
        xmlRelaxNGFreeStates(NULL, ctxt->freeState);
    }
    if (ctxt->freeStates != NULL) {
        for (k = 0; k < ctxt->freeStatesNr; k++) {
            xmlRelaxNGFreeStates(NULL, ctxt->freeStates[k]);
        }
        xmlFree(ctxt->freeStates);
    }
    if (ctxt->errTab != NULL)
        xmlFree(ctxt->errTab);
    if (ctxt->elemTab != NULL) {
        xmlRegExecCtxtPtr exec;

        exec = xmlRelaxNGElemPop(ctxt);
        while (exec != NULL) {
            xmlRegFreeExecCtxt(exec);
            exec = xmlRelaxNGElemPop(ctxt);
        }
        xmlFree(ctxt->elemTab);
    }
    xmlFree(ctxt);
}